

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::ByteSizeLong
          (VisionFeaturePrint_Objects *this)

{
  uint uVar1;
  long lVar2;
  Type *value;
  size_t sVar3;
  ulong uVar4;
  uint index;
  uint uVar5;
  size_t sVar6;
  
  uVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  sVar6 = (ulong)uVar1 * 2;
  uVar5 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
    index = 0;
  }
  for (; uVar5 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->output_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar6 = sVar6 + sVar3;
  }
  if ((long)this->version_ != 0) {
    uVar4 = (long)this->version_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar6 = sVar6 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar6;
  return sVar6;
}

Assistant:

size_t VisionFeaturePrint_Objects::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string output = 100;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(output_.size());
  for (int i = 0, n = output_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      output_.Get(i));
  }

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
  if (this->_internal_version() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_version());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}